

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_int xmrig::OclLib::release(cl_context context)

{
  char *fmt;
  cl_int ret_00;
  char *pcVar1;
  cl_context in_RDI;
  cl_int ret;
  
  ret_00 = (*pReleaseContext)(in_RDI);
  fmt = kErrorTemplate;
  if (ret_00 != 0) {
    pcVar1 = OclError::toString(ret_00);
    Log::print(ERR,fmt,pcVar1,kReleaseContext);
  }
  return ret_00;
}

Assistant:

cl_int xmrig::OclLib::release(cl_context context) noexcept
{
    assert(pReleaseContext != nullptr);

    LOG_REFS("%p %u ~context", context, getUint(context, CL_CONTEXT_REFERENCE_COUNT));

    const cl_int ret = pReleaseContext(context);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseContext);
    }

    return ret;
}